

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp3::sPolynomial10
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  double dVar4;
  double dVar5;
  Index in_stack_fffffffffffffee8;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *in_stack_fffffffffffffef0;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *this;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x940476);
  row = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_fffffffffffffef0,(Index)row,0x940496);
  dVar4 = row / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_fffffffffffffef0,(Index)row,0x9404bc);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9404dd);
  dVar5 = (double)this / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94050d);
  *pSVar3 = dVar4 - dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94052e);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94054f);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940576);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940597);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9405cf);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9405f6);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940617);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940638);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94065f);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940680);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9406b1);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9406d2);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9406f3);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94071a);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94073b);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940773);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94079a);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9407bb);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9407df);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94080c);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940830);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94086b);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940898);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9408bc);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9408e0);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94090d);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940931);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94096b);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x94098f);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9409b3);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x9409de);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940a02);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940a3d);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940a6a);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940a8e);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940ab2);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940adf);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940b03);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940b3e);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940b6b);
  *pSVar3 = -dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940b8f);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940bb3);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,(Index)row,0x940be0);
  *pSVar3 = dVar4 / dVar5;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial10( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(10,0) = (groebnerMatrix(3,9)/(groebnerMatrix(3,8))-groebnerMatrix(4,10)/(groebnerMatrix(4,9)));
  groebnerMatrix(10,1) = groebnerMatrix(3,10)/(groebnerMatrix(3,8));
  groebnerMatrix(10,2) = -groebnerMatrix(4,11)/(groebnerMatrix(4,9));
  groebnerMatrix(10,3) = (groebnerMatrix(3,11)/(groebnerMatrix(3,8))-groebnerMatrix(4,12)/(groebnerMatrix(4,9)));
  groebnerMatrix(10,4) = groebnerMatrix(3,12)/(groebnerMatrix(3,8));
  groebnerMatrix(10,5) = -groebnerMatrix(4,13)/(groebnerMatrix(4,9));
  groebnerMatrix(10,6) = groebnerMatrix(3,13)/(groebnerMatrix(3,8));
  groebnerMatrix(10,8) = -groebnerMatrix(4,14)/(groebnerMatrix(4,9));
  groebnerMatrix(10,9) = (groebnerMatrix(3,14)/(groebnerMatrix(3,8))-groebnerMatrix(4,15)/(groebnerMatrix(4,9)));
  groebnerMatrix(10,10) = groebnerMatrix(3,15)/(groebnerMatrix(3,8));
  groebnerMatrix(10,11) = -groebnerMatrix(4,16)/(groebnerMatrix(4,9));
  groebnerMatrix(10,12) = groebnerMatrix(3,16)/(groebnerMatrix(3,8));
  groebnerMatrix(10,14) = -groebnerMatrix(4,17)/(groebnerMatrix(4,9));
  groebnerMatrix(10,15) = groebnerMatrix(3,17)/(groebnerMatrix(3,8));
}